

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

bool __thiscall cmFindLibraryHelper::HasValidSuffix(cmFindLibraryHelper *this,string *name)

{
  pointer pbVar1;
  long lVar2;
  __type _Var3;
  pointer pbVar4;
  string suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar4 = (this->Suffixes).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    pbVar1 = (this->Suffixes).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar4 == pbVar1) {
LAB_0035f790:
      return pbVar4 != pbVar1;
    }
    std::__cxx11::string::string((string *)&suffix,(string *)pbVar4);
    if (suffix._M_string_length < name->_M_string_length) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)name);
      _Var3 = std::operator==(&local_50,&suffix);
      std::__cxx11::string::~string((string *)&local_50);
      if (!_Var3) {
        std::__cxx11::string::append((char *)&suffix);
        lVar2 = std::__cxx11::string::find((string *)name,(ulong)&suffix);
        if (lVar2 == -1) goto LAB_0035f76d;
      }
      std::__cxx11::string::~string((string *)&suffix);
      goto LAB_0035f790;
    }
LAB_0035f76d:
    std::__cxx11::string::~string((string *)&suffix);
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

bool cmFindLibraryHelper::HasValidSuffix(std::string const& name)
{
  for(std::vector<std::string>::const_iterator si = this->Suffixes.begin();
      si != this->Suffixes.end(); ++si)
    {
    std::string suffix = *si;
    if(name.length() <= suffix.length())
      {
      continue;
      }
    // Check if the given name ends in a valid library suffix.
    if(name.substr(name.size()-suffix.length()) == suffix)
      {
      return true;
      }
    // Check if a valid library suffix is somewhere in the name,
    // this may happen e.g. for versioned shared libraries: libfoo.so.2
    suffix += ".";
    if(name.find(suffix) != name.npos)
      {
      return true;
      }
    }
  return false;
}